

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O0

void __thiscall
Minisat::Solver::analyze
          (Solver *this,CRef confl,vec<Minisat::Lit,_int> *out_learnt,int *out_btlevel)

{
  bool bVar1;
  Size SVar2;
  int iVar3;
  int iVar4;
  Lit LVar5;
  CRef CVar6;
  Clause *pCVar7;
  Lit *pLVar8;
  char *pcVar9;
  Lit *pLVar10;
  int local_c4;
  int j_2;
  Lit p_1;
  int local_b0;
  Size local_ac;
  int i_1;
  int max_i;
  int local_a0;
  int k;
  Clause *c_1;
  Var x;
  int local_7c;
  int local_78;
  int j;
  int i;
  Lit local_4c;
  undefined4 local_48;
  Lit q;
  int j_1;
  Clause *c;
  Lit local_30;
  int index;
  Lit p;
  int pathC;
  int *out_btlevel_local;
  vec<Minisat::Lit,_int> *out_learnt_local;
  CRef confl_local;
  Solver *this_local;
  
  index = 0;
  local_30.x = -2;
  _p = out_btlevel;
  vec<Minisat::Lit,_int>::push(out_learnt);
  SVar2 = vec<Minisat::Lit,_int>::size(&this->trail);
  c._4_4_ = SVar2 + -1;
  out_learnt_local._4_4_ = confl;
  do {
    if (out_learnt_local._4_4_ == 0xffffffff) {
      __assert_fail("confl != CRef_Undef",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/Udopia[P]minisat/minisat/core/Solver.cc"
                    ,0x133,"void Minisat::Solver::analyze(CRef, vec<Lit> &, int &)");
    }
    pCVar7 = ClauseAllocator::operator[](&this->ca,out_learnt_local._4_4_);
    bVar1 = Clause::learnt(pCVar7);
    if (bVar1) {
      claBumpActivity(this,pCVar7);
    }
    local_48 = 0xfffffffe;
    bVar1 = Lit::operator==(&local_30,(Lit)0xfffffffe);
    for (q.x = (int)!bVar1; LVar5.x = q.x, iVar3 = Clause::size(pCVar7), iVar4 = c._4_4_,
        LVar5.x < iVar3; q.x = q.x + 1) {
      pLVar8 = Clause::operator[](pCVar7,q.x);
      local_4c.x = pLVar8->x;
      iVar4 = var(local_4c);
      pcVar9 = IntMap<int,_char,_Minisat::MkIndexDefault<int>_>::operator[]
                         (&(this->seen).super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>,iVar4
                         );
      if (*pcVar9 == '\0') {
        iVar4 = var(local_4c);
        iVar4 = level(this,iVar4);
        if (0 < iVar4) {
          iVar4 = var(local_4c);
          varBumpActivity(this,iVar4);
          iVar4 = var(local_4c);
          pcVar9 = IntMap<int,_char,_Minisat::MkIndexDefault<int>_>::operator[]
                             (&(this->seen).super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>,
                              iVar4);
          *pcVar9 = '\x01';
          iVar4 = var(local_4c);
          iVar4 = level(this,iVar4);
          iVar3 = decisionLevel(this);
          if (iVar4 < iVar3) {
            vec<Minisat::Lit,_int>::push(out_learnt,&local_4c);
          }
          else {
            index = index + 1;
          }
        }
      }
    }
    do {
      c._4_4_ = iVar4;
      pLVar8 = vec<Minisat::Lit,_int>::operator[](&this->trail,c._4_4_);
      iVar4 = var((Lit)pLVar8->x);
      pcVar9 = IntMap<int,_char,_Minisat::MkIndexDefault<int>_>::operator[]
                         (&(this->seen).super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>,iVar4
                         );
      iVar4 = c._4_4_ + -1;
    } while (*pcVar9 == '\0');
    pLVar8 = vec<Minisat::Lit,_int>::operator[](&this->trail,c._4_4_);
    local_30.x = pLVar8->x;
    iVar4 = var(local_30);
    out_learnt_local._4_4_ = reason(this,iVar4);
    iVar4 = var(local_30);
    pcVar9 = IntMap<int,_char,_Minisat::MkIndexDefault<int>_>::operator[]
                       (&(this->seen).super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>,iVar4);
    *pcVar9 = '\0';
    index = index + -1;
    c._4_4_ = c._4_4_ + -1;
  } while (0 < index);
  LVar5 = operator~(local_30);
  pLVar8 = vec<Minisat::Lit,_int>::operator[](out_learnt,0);
  pLVar8->x = LVar5.x;
  vec<Minisat::Lit,_int>::copyTo(out_learnt,&this->analyze_toclear);
  if (this->ccmin_mode == 2) {
    local_7c = 1;
    for (local_78 = 1; SVar2 = vec<Minisat::Lit,_int>::size(out_learnt), local_78 < SVar2;
        local_78 = local_78 + 1) {
      pLVar8 = vec<Minisat::Lit,_int>::operator[](out_learnt,local_78);
      iVar4 = var((Lit)pLVar8->x);
      CVar6 = reason(this,iVar4);
      if (CVar6 == 0xffffffff) {
LAB_00113bbe:
        pLVar8 = vec<Minisat::Lit,_int>::operator[](out_learnt,local_78);
        pLVar10 = vec<Minisat::Lit,_int>::operator[](out_learnt,local_7c);
        pLVar10->x = pLVar8->x;
        local_7c = local_7c + 1;
      }
      else {
        pLVar8 = vec<Minisat::Lit,_int>::operator[](out_learnt,local_78);
        bVar1 = litRedundant(this,(Lit)pLVar8->x);
        if (!bVar1) goto LAB_00113bbe;
      }
    }
  }
  else if (this->ccmin_mode == 1) {
    local_7c = 1;
    for (local_78 = 1; SVar2 = vec<Minisat::Lit,_int>::size(out_learnt), local_78 < SVar2;
        local_78 = local_78 + 1) {
      pLVar8 = vec<Minisat::Lit,_int>::operator[](out_learnt,local_78);
      iVar4 = var((Lit)pLVar8->x);
      CVar6 = reason(this,iVar4);
      if (CVar6 == 0xffffffff) {
        pLVar8 = vec<Minisat::Lit,_int>::operator[](out_learnt,local_78);
        pLVar10 = vec<Minisat::Lit,_int>::operator[](out_learnt,local_7c);
        pLVar10->x = pLVar8->x;
        local_7c = local_7c + 1;
      }
      else {
        pLVar8 = vec<Minisat::Lit,_int>::operator[](out_learnt,local_78);
        iVar4 = var((Lit)pLVar8->x);
        CVar6 = reason(this,iVar4);
        pCVar7 = ClauseAllocator::operator[](&this->ca,CVar6);
        for (local_a0 = 1; iVar4 = Clause::size(pCVar7), local_a0 < iVar4; local_a0 = local_a0 + 1)
        {
          pLVar8 = Clause::operator[](pCVar7,local_a0);
          iVar4 = var((Lit)pLVar8->x);
          pcVar9 = IntMap<int,_char,_Minisat::MkIndexDefault<int>_>::operator[]
                             (&(this->seen).super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>,
                              iVar4);
          if (*pcVar9 == '\0') {
            pLVar8 = Clause::operator[](pCVar7,local_a0);
            iVar4 = var((Lit)pLVar8->x);
            iVar4 = level(this,iVar4);
            if (0 < iVar4) {
              pLVar8 = vec<Minisat::Lit,_int>::operator[](out_learnt,local_78);
              pLVar10 = vec<Minisat::Lit,_int>::operator[](out_learnt,local_7c);
              pLVar10->x = pLVar8->x;
              local_7c = local_7c + 1;
              break;
            }
          }
        }
      }
    }
  }
  else {
    local_7c = vec<Minisat::Lit,_int>::size(out_learnt);
    local_78 = local_7c;
  }
  SVar2 = vec<Minisat::Lit,_int>::size(out_learnt);
  this->max_literals = (long)SVar2 + this->max_literals;
  vec<Minisat::Lit,_int>::shrink(out_learnt,local_78 - local_7c);
  SVar2 = vec<Minisat::Lit,_int>::size(out_learnt);
  this->tot_literals = (long)SVar2 + this->tot_literals;
  SVar2 = vec<Minisat::Lit,_int>::size(out_learnt);
  if (SVar2 == 1) {
    *_p = 0;
  }
  else {
    local_ac = 1;
    for (local_b0 = 2; SVar2 = vec<Minisat::Lit,_int>::size(out_learnt), local_b0 < SVar2;
        local_b0 = local_b0 + 1) {
      pLVar8 = vec<Minisat::Lit,_int>::operator[](out_learnt,local_b0);
      iVar4 = var((Lit)pLVar8->x);
      iVar4 = level(this,iVar4);
      pLVar8 = vec<Minisat::Lit,_int>::operator[](out_learnt,local_ac);
      iVar3 = var((Lit)pLVar8->x);
      iVar3 = level(this,iVar3);
      if (iVar3 < iVar4) {
        local_ac = local_b0;
      }
    }
    pLVar8 = vec<Minisat::Lit,_int>::operator[](out_learnt,local_ac);
    LVar5.x = pLVar8->x;
    pLVar8 = vec<Minisat::Lit,_int>::operator[](out_learnt,1);
    pLVar10 = vec<Minisat::Lit,_int>::operator[](out_learnt,local_ac);
    pLVar10->x = pLVar8->x;
    pLVar8 = vec<Minisat::Lit,_int>::operator[](out_learnt,1);
    pLVar8->x = LVar5.x;
    iVar4 = var(LVar5);
    iVar4 = level(this,iVar4);
    *_p = iVar4;
  }
  for (local_c4 = 0; SVar2 = vec<Minisat::Lit,_int>::size(&this->analyze_toclear), local_c4 < SVar2;
      local_c4 = local_c4 + 1) {
    pLVar8 = vec<Minisat::Lit,_int>::operator[](&this->analyze_toclear,local_c4);
    iVar4 = var((Lit)pLVar8->x);
    pcVar9 = IntMap<int,_char,_Minisat::MkIndexDefault<int>_>::operator[]
                       (&(this->seen).super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>,iVar4);
    *pcVar9 = '\0';
  }
  return;
}

Assistant:

void Solver::analyze(CRef confl, vec<Lit>& out_learnt, int& out_btlevel)
{
    int pathC = 0;
    Lit p     = lit_Undef;

    // Generate conflict clause:
    //
    out_learnt.push();      // (leave room for the asserting literal)
    int index   = trail.size() - 1;

    do{
        assert(confl != CRef_Undef); // (otherwise should be UIP)
        Clause& c = ca[confl];

        if (c.learnt())
            claBumpActivity(c);

        for (int j = (p == lit_Undef) ? 0 : 1; j < c.size(); j++){
            Lit q = c[j];

            if (!seen[var(q)] && level(var(q)) > 0){
                varBumpActivity(var(q));
                seen[var(q)] = 1;
                if (level(var(q)) >= decisionLevel())
                    pathC++;
                else
                    out_learnt.push(q);
            }
        }
        
        // Select next clause to look at:
        while (!seen[var(trail[index--])]);
        p     = trail[index+1];
        confl = reason(var(p));
        seen[var(p)] = 0;
        pathC--;

    }while (pathC > 0);
    out_learnt[0] = ~p;

    // Simplify conflict clause:
    //
    int i, j;
    out_learnt.copyTo(analyze_toclear);
    if (ccmin_mode == 2){
        for (i = j = 1; i < out_learnt.size(); i++)
            if (reason(var(out_learnt[i])) == CRef_Undef || !litRedundant(out_learnt[i]))
                out_learnt[j++] = out_learnt[i];
        
    }else if (ccmin_mode == 1){
        for (i = j = 1; i < out_learnt.size(); i++){
            Var x = var(out_learnt[i]);

            if (reason(x) == CRef_Undef)
                out_learnt[j++] = out_learnt[i];
            else{
                Clause& c = ca[reason(var(out_learnt[i]))];
                for (int k = 1; k < c.size(); k++)
                    if (!seen[var(c[k])] && level(var(c[k])) > 0){
                        out_learnt[j++] = out_learnt[i];
                        break; }
            }
        }
    }else
        i = j = out_learnt.size();

    max_literals += out_learnt.size();
    out_learnt.shrink(i - j);
    tot_literals += out_learnt.size();

    // Find correct backtrack level:
    //
    if (out_learnt.size() == 1)
        out_btlevel = 0;
    else{
        int max_i = 1;
        // Find the first literal assigned at the next-highest level:
        for (int i = 2; i < out_learnt.size(); i++)
            if (level(var(out_learnt[i])) > level(var(out_learnt[max_i])))
                max_i = i;
        // Swap-in this literal at index 1:
        Lit p             = out_learnt[max_i];
        out_learnt[max_i] = out_learnt[1];
        out_learnt[1]     = p;
        out_btlevel       = level(var(p));
    }

    for (int j = 0; j < analyze_toclear.size(); j++) seen[var(analyze_toclear[j])] = 0;    // ('seen[]' is now cleared)
}